

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopEnd<(Js::LayoutSize)2,false>
          (InterpreterStackFrame *this,byte *ip)

{
  uint loopNumber_00;
  bool bVar1;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOVar2;
  FunctionBody *this_00;
  DynamicProfileInfo *pDVar3;
  ScriptContext *this_01;
  ThreadContext *this_02;
  ThreadContext *threadContext;
  FunctionBody *fn;
  InterpreterStackFrame *pIStack_20;
  uint32 loopNumber;
  byte *ip_local;
  InterpreterStackFrame *this_local;
  
  pIStack_20 = (InterpreterStackFrame *)ip;
  ip_local = (byte *)this;
  pOVar2 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
                     ((ByteCodeReader *)this,(byte **)&stack0xffffffffffffffe0);
  loopNumber_00 = pOVar2->C1;
  if (((byte)this[0xd6] >> 4 & 1) == 0) {
    this_local = pIStack_20;
  }
  else {
    CheckIfLoopIsHot(this,*(uint *)(this + 0xd0));
    this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
    bVar1 = FunctionBody::HasDynamicProfileInfo(this_00);
    if (bVar1) {
      pDVar3 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
      DynamicProfileInfo::SetLoopInterpreted(pDVar3,loopNumber_00);
      if ((DAT_01eafd40 <= *(uint *)(this + 0xd0)) ||
         ((*(int *)(this + 0xd0) == 0 &&
          (bVar1 = FunctionBody::DoJITLoopBody(*(FunctionBody **)(this + 0x88)), !bVar1)))) {
        pDVar3 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
        DynamicProfileInfo::SetMemOpMinReached(pDVar3,loopNumber_00);
      }
    }
    *(undefined4 *)(this + 0xd0) = 0;
    this_01 = GetScriptContext(this);
    this_02 = ScriptContext::GetThreadContext(this_01);
    ThreadContext::AddImplicitCallFlags
              (this_02,*(ImplicitCallFlags *)(*(long *)(this + 0xc0) + (ulong)loopNumber_00));
    ThreadContext::DecrementLoopDepth(this_02);
    this_local = pIStack_20;
  }
  return (byte *)this_local;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopEnd(const byte * ip)
    {
        uint32 loopNumber = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        this->CheckIfLoopIsHot(this->currentLoopCounter);
        Js::FunctionBody *fn = this->function->GetFunctionBody();
        if (fn->HasDynamicProfileInfo())
        {
            fn->GetAnyDynamicProfileInfo()->SetLoopInterpreted(loopNumber);
            // If the counter is 0, there is a high chance that some config disabled tracking that information. (ie: -off:jitloopbody)
            // Assume it is valid for memop in this case.
            if (this->currentLoopCounter >= (uint)CONFIG_FLAG(MinMemOpCount) ||
                (this->currentLoopCounter == 0 && !this->m_functionBody->DoJITLoopBody())
                )
            {
                // This flag becomes relevant only if the loop has been interpreted
                fn->GetAnyDynamicProfileInfo()->SetMemOpMinReached(loopNumber);
            }
        }

        this->currentLoopCounter = 0;

        if (profiled)
        {
            Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
            OP_RecordImplicitCall(loopNumber);

            if (switchProfileModeOnLoopEndNumber == loopNumber)
            {
                // Stop profiling since the jitted loop body would be exiting the loop
                Assert(!switchProfileMode);
                switchProfileMode = true;
                switchProfileModeOnLoopEndNumber = 0u - 1;
            }
        }

        // Restore the implicit call flags state and add with flags in the loop as well
        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);

        threadContext->DecrementLoopDepth();
        return ip;
    }